

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m256v_LU_mult(m256v *LU,int *rp,int *cp,m256v *X,m256v *Y_out)

{
  ulong uVar1;
  int i;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int i_1;
  long lVar6;
  
  for (iVar2 = 0; iVar2 < Y_out->n_row; iVar2 = iVar2 + 1) {
    m256v_clear_row(Y_out,iVar2);
  }
  for (lVar6 = 0; lVar4 = (long)LU->n_row, lVar5 = lVar4, lVar6 < lVar4; lVar6 = lVar6 + 1) {
    iVar2 = rp[lVar6];
    for (lVar4 = (long)LU->n_col; lVar6 < lVar4; lVar4 = lVar4 + -1) {
      m256v_multadd_row(X,cp[lVar4 + -1],LU->e[lVar4 + -1 + LU->rstride * lVar6],Y_out,iVar2);
    }
  }
  while (lVar4 = lVar4 + -1, 0 < lVar5) {
    lVar6 = lVar5 + -1;
    if (LU->n_col < lVar5) {
      for (uVar1 = (ulong)(uint)LU->n_col; lVar5 = lVar6, 0 < (int)uVar1; uVar1 = uVar1 - 1) {
        m256v_multadd_row(Y_out,rp[uVar1 - 1],LU->e[(uVar1 - 1) + LU->rstride * lVar4],Y_out,
                          rp[lVar6]);
      }
    }
    else {
      for (uVar3 = (int)lVar5 - 2; lVar5 = lVar6, -1 < (int)uVar3; uVar3 = uVar3 - 1) {
        m256v_multadd_row(Y_out,rp[uVar3],LU->e[(ulong)uVar3 + LU->rstride * lVar6],Y_out,rp[lVar6])
        ;
      }
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_mult)(const MV_GEN_TYPE* LU,
		   const int* rp,
		   const int* cp,
		   const MV_GEN_TYPE* X,
		   MV_GEN_TYPE* Y_out)
{
	/* Check dimensions */
	assert(LU->n_col == X->n_row);
	assert(LU->n_row == Y_out->n_row);
	assert(X->n_col == Y_out->n_col);

	/* Clear out the rows in the target vector */
	for (int i = 0; i < Y_out->n_row; ++i) {
		MV_GEN_N(_clear_row)(Y_out, i);
	}

	/* Multiply with U */
	for (int i = 0; i < LU->n_row; ++i) {
		const int t = rp[i];
		for (int j = LU->n_col - 1; j >= i; --j) {
			MV_GEN_N(_multadd_row)(X, cp[j],
					MV_GEN_N(_get_el)(LU, i, j),
					Y_out, t);
		}
	}

	/* Multiply with L */
	for (int i = LU->n_row - 1; i >= 0; --i) {
		if (i >= LU->n_col) {
			/* We're in the rectangle below the triangular part
			 */
			for (int j = LU->n_col - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(Y_out, rp[j],
						MV_GEN_N(_get_el)(LU, i, j),
						Y_out, rp[i]);
			}
		} else {
			/* i < LU->n_col, we're in the triangular part */
			for (int j = i - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(Y_out, rp[j],
						MV_GEN_N(_get_el)(LU, i, j),
						Y_out, rp[i]);
			}
		}
	}
}